

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# superstep.hpp
# Opt level: O0

void __thiscall Superstep<int>::Superstep(Superstep<int> *this)

{
  function<int_(std::vector<LockableVector<int>,_std::allocator<LockableVector<int>_>_>_&)> *in_RDI;
  int in_stack_ffffffffffffff9c;
  Barrier *in_stack_ffffffffffffffa0;
  Barrier *this_00;
  anon_class_8_1_8991fb9c *__f;
  function<int_(std::vector<LockableVector<int>,_std::allocator<LockableVector<int>_>_>_&)> *__x;
  
  *(undefined4 *)&(in_RDI->super__Function_base)._M_functor = 0xfffffffe;
  *(undefined4 *)((long)&(in_RDI->super__Function_base)._M_functor + 4) = 0xffffffff;
  __f = (anon_class_8_1_8991fb9c *)((long)&(in_RDI->super__Function_base)._M_functor + 8);
  std::
  vector<std::pair<std::function<void_(int,_std::vector<int,_std::allocator<int>_>_&)>,_std::function<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_(int,_std::vector<int,_std::allocator<int>_>_&)>_>,_std::allocator<std::pair<std::function<void_(int,_std::vector<int,_std::allocator<int>_>_&)>,_std::function<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_(int,_std::vector<int,_std::allocator<int>_>_&)>_>_>_>
  ::vector((vector<std::pair<std::function<void_(int,_std::vector<int,_std::allocator<int>_>_&)>,_std::function<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_(int,_std::vector<int,_std::allocator<int>_>_&)>_>,_std::allocator<std::pair<std::function<void_(int,_std::vector<int,_std::allocator<int>_>_&)>,_std::function<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_(int,_std::vector<int,_std::allocator<int>_>_&)>_>_>_>
            *)0x10928e);
  __x = in_RDI + 1;
  Barrier::Barrier(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
  this_00 = (Barrier *)(in_RDI + 4);
  Barrier::Barrier(this_00,in_stack_ffffffffffffff9c);
  Barrier::Barrier(this_00,in_stack_ffffffffffffff9c);
  std::mutex::mutex((mutex *)0x1092e2);
  std::function<int_(std::vector<LockableVector<int>,_std::allocator<LockableVector<int>_>_>_&)>::
  function((function<int_(std::vector<LockableVector<int>,_std::allocator<LockableVector<int>_>_>_&)>
            *)this_00);
  std::function<int(std::vector<LockableVector<int>,std::allocator<LockableVector<int>>>&)>::
  function<Superstep<int>::Superstep()::_lambda(std::vector<LockableVector<int>,std::allocator<LockableVector<int>>>&)_1_,void>
            (in_RDI,__f);
  std::function<int_(std::vector<LockableVector<int>,_std::allocator<LockableVector<int>_>_>_&)>::
  operator=(in_RDI,__x);
  std::function<int_(std::vector<LockableVector<int>,_std::allocator<LockableVector<int>_>_>_&)>::
  ~function((function<int_(std::vector<LockableVector<int>,_std::allocator<LockableVector<int>_>_>_&)>
             *)0x10932c);
  return;
}

Assistant:

Superstep<T>::Superstep () : startBarrier (0), compPhaseBarrier(0), commPhaseBarrier(0) {
	atExitF	= AtExitFunction ([&] (std::vector<LockableVector<T>> &outputItems) {
		return NEXT_STEP_FLAG;
	});
}